

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O3

APInt __thiscall llvm::APInt::usub_ov(APInt *this,APInt *RHS,bool *Overflow)

{
  int iVar1;
  anon_union_8_2_1313ab2f_for_U __dest;
  undefined8 in_RCX;
  undefined8 extraout_RDX;
  ulong __n;
  APInt AVar2;
  anon_union_8_2_1313ab2f_for_U local_40;
  uint local_38;
  
  local_38 = RHS->BitWidth;
  if ((ulong)local_38 < 0x41) {
    __dest = RHS->U;
  }
  else {
    __n = (ulong)((uint)((ulong)local_38 + 0x3f >> 3) & 0xfffffff8);
    __dest.pVal = (uint64_t *)operator_new__(__n);
    memcpy(__dest.pVal,(RHS->U).pVal,__n);
  }
  local_40 = __dest;
  operator-=((APInt *)&local_40,(APInt *)Overflow);
  this->BitWidth = local_38;
  this->U = local_40;
  local_38 = 0;
  iVar1 = compare(this,RHS);
  *(bool *)in_RCX = 0 < iVar1;
  AVar2._8_8_ = extraout_RDX;
  AVar2.U.pVal = (uint64_t *)this;
  return AVar2;
}

Assistant:

APInt APInt::usub_ov(const APInt &RHS, bool &Overflow) const {
  APInt Res = *this-RHS;
  Overflow = Res.ugt(*this);
  return Res;
}